

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O1

void print_ast_enum(FILE *out,AST_Type op)

{
  size_t __size;
  int __c;
  char *pcVar1;
  
  switch(op) {
  case OP_COMMA:
    __c = 0x2c;
    goto LAB_00144baf;
  case OP_ADDITION:
  case OP_UNARY_PLUS:
    __c = 0x2b;
    goto LAB_00144baf;
  case OP_SUBTRACTION:
  case OP_UNARY_MINUS:
    __c = 0x2d;
    goto LAB_00144baf;
  case OP_MUL:
  case OP_DEREFERENCE:
    __c = 0x2a;
    goto LAB_00144baf;
  case OP_DIV:
    __c = 0x2f;
    goto LAB_00144baf;
  case OP_REMAINDER:
    pcVar1 = "%";
    goto LAB_00144b03;
  case OP_COND:
    pcVar1 = "CONDITIONAL";
    __size = 0xb;
    goto LAB_00144ba0;
  case OP_FUNCTION:
    pcVar1 = "FUNCTION_CALL";
    goto LAB_00144a18;
  case OP_ASSIGN:
    __c = 0x3d;
    goto LAB_00144baf;
  case OP_ADD_ASSIGN:
    pcVar1 = "+=";
    break;
  case OP_SUBTRACT_ASSIGN:
    pcVar1 = "-=";
    break;
  case OP_MULTIPLY_ASSIGN:
    pcVar1 = "*=";
    break;
  case OP_REMAINDER_ASSIGN:
    pcVar1 = "%=";
LAB_00144b03:
    fprintf((FILE *)out,pcVar1);
    return;
  case OP_DIV_ASSIGN:
    pcVar1 = "/=";
    break;
  case OP_SHIFT_LEFT_ASSIGN:
    pcVar1 = ">>=";
    goto LAB_00144b14;
  case OP_SHIFT_RIGHT_ASSIGN:
    pcVar1 = "<<=";
    goto LAB_00144b14;
  case OP_AND_ASSIGN:
    pcVar1 = "&=";
    break;
  case OP_XOR_ASSIGN:
    pcVar1 = "^=";
    break;
  case OP_PIPE_ASSIGN:
    pcVar1 = "|=";
    break;
  case OP_NOP:
    pcVar1 = "NOP";
    goto LAB_00144b14;
  case OP_LOGICAL_OR:
    pcVar1 = "||";
    break;
  case OP_LOGICAL_AND:
    pcVar1 = "&&";
    break;
  case OP_LOGICAL_NOT:
    __c = 0x21;
    goto LAB_00144baf;
  case OP_BITWISE_OR:
    __c = 0x7c;
    goto LAB_00144baf;
  case OP_BITWISE_AND:
  case OP_ADDR_OF:
    __c = 0x26;
    goto LAB_00144baf;
  case OP_BITWISE_XOR:
    __c = 0x5e;
    goto LAB_00144baf;
  case OP_BITWISE_NOT:
    __c = 0x7e;
    goto LAB_00144baf;
  case OP_MEMBER_TROUGH_PTR:
    pcVar1 = "->";
    break;
  case OP_MEMBER:
    __c = 0x2e;
    goto LAB_00144baf;
  case OP_ARR_SUBSCRIPT:
    pcVar1 = "ARR_SUBSCRIPT";
LAB_00144a18:
    __size = 0xd;
    goto LAB_00144ba0;
  case OP_POSTFIX_INC:
  case OP_PREFIX_INC:
    pcVar1 = "++";
    break;
  case OP_POSTFIX_DEC:
  case OP_PREFIX_DEC:
    pcVar1 = "--";
    break;
  case OP_CAST:
    pcVar1 = "CAST";
    goto LAB_00144bf1;
  case OP_SIZEOF:
    pcVar1 = "sizeof";
    goto LAB_00144b5e;
  case OP_SHIFT_LEFT:
    pcVar1 = "<<";
    break;
  case OP_SHIFT_RIGHT:
    pcVar1 = ">>";
    break;
  case OP_LESS_EQ:
    pcVar1 = "<=";
    break;
  case OP_GREATER_EQ:
    pcVar1 = ">=";
    break;
  case OP_LESS:
    __c = 0x3c;
    goto LAB_00144baf;
  case OP_GREATER:
    __c = 0x3e;
LAB_00144baf:
    fputc(__c,(FILE *)out);
    return;
  case OP_EQUAL:
    pcVar1 = "==";
    break;
  case OP_NOT_EQUAL:
    pcVar1 = "!=";
    break;
  case OP_LVALUE:
    pcVar1 = "LVALUE";
    goto LAB_00144b5e;
  case OP_CONSTANT:
    pcVar1 = "CONSTANT";
    goto LAB_00144be3;
  case OP_STRING_LITERAL:
    pcVar1 = "STRING_LITERAL";
    __size = 0xe;
    goto LAB_00144ba0;
  case ST_COMPOUND:
    pcVar1 = "COMPOUND";
    goto LAB_00144be3;
  case ST_EXPRESSION:
    pcVar1 = "EXPRESSION";
    __size = 10;
    goto LAB_00144ba0;
  case ST_SWITCH:
    pcVar1 = "switch";
    goto LAB_00144b5e;
  case ST_IF:
    pcVar1 = "if";
    break;
  case ST_WHILE:
    pcVar1 = "while";
    goto LAB_00144bbe;
  case ST_DO_WHILE:
    pcVar1 = "do_while";
    goto LAB_00144be3;
  case ST_GOTO:
    pcVar1 = "goto";
    goto LAB_00144bf1;
  case ST_LABEL:
    pcVar1 = "LABEL";
    goto LAB_00144bbe;
  case ST_CASE:
    pcVar1 = "case";
LAB_00144bf1:
    __size = 4;
    goto LAB_00144ba0;
  case ST_DEFAULT:
    pcVar1 = "default";
    __size = 7;
    goto LAB_00144ba0;
  case ST_CONTINUE:
    pcVar1 = "continue";
LAB_00144be3:
    __size = 8;
    goto LAB_00144ba0;
  case ST_BREAK:
    pcVar1 = "break";
    goto LAB_00144bbe;
  case ST_RETURN:
    pcVar1 = "return";
LAB_00144b5e:
    __size = 6;
    goto LAB_00144ba0;
  case ST_FOR:
    pcVar1 = "for";
LAB_00144b14:
    __size = 3;
    goto LAB_00144ba0;
  default:
    pcVar1 = "NOT_POSSIBLE";
    __size = 0xc;
    goto LAB_00144ba0;
  case ST_FUNCTION_DEFINITION:
    pcVar1 = "FUNCTION_DEFINITION";
    __size = 0x13;
    goto LAB_00144ba0;
  case TRANSLATION_UNIT:
    pcVar1 = "TRANSLATION_UNIT";
    __size = 0x10;
    goto LAB_00144ba0;
  case ERROR:
    pcVar1 = "ERROR";
LAB_00144bbe:
    __size = 5;
    goto LAB_00144ba0;
  }
  __size = 2;
LAB_00144ba0:
  fwrite(pcVar1,__size,1,(FILE *)out);
  return;
}

Assistant:

void print_ast_enum(FILE *out,enum AST_Type op)
{
	switch(op)
	{
	case OP_COMMA:
		fprintf(out,",");break;
	case OP_ADDITION:
		fprintf(out,"+");break;
	case OP_SUBTRACTION:
		fprintf(out,"-");break;
	case OP_MUL:
		fprintf(out,"*");break;
	case OP_DIV:
		fprintf(out,"/");break;
	case OP_REMAINDER:
		fprintf(out,"%");break;
	case OP_COND:
		fprintf(out,"CONDITIONAL");break;
	case OP_FUNCTION:
		fprintf(out,"FUNCTION_CALL");break;
	case OP_ASSIGN:
		fprintf(out,"=");break;
	case OP_ADD_ASSIGN:
		fprintf(out,"+=");break;
	case OP_SUBTRACT_ASSIGN:
		fprintf(out,"-=");break;
	case OP_MULTIPLY_ASSIGN:
		fprintf(out,"*=");break;
	case OP_REMAINDER_ASSIGN:
		fprintf(out,"%=");break;
	case OP_DIV_ASSIGN:
		fprintf(out,"/=");break;
	case OP_SHIFT_LEFT_ASSIGN:
		fprintf(out,">>=");break;
	case OP_SHIFT_RIGHT_ASSIGN:
		fprintf(out,"<<=");break;
	case OP_AND_ASSIGN:
		fprintf(out,"&=");break;
	case OP_XOR_ASSIGN:
		fprintf(out,"^=");break;
	case OP_PIPE_ASSIGN:
		fprintf(out,"|=");break;
	case OP_NOP:
		fprintf(out,"NOP");break;
	case OP_LOGICAL_OR:
		fprintf(out,"||");break;
	case OP_LOGICAL_AND:
		fprintf(out,"&&");break;
	case OP_LOGICAL_NOT:
		fprintf(out,"!");break;
	case OP_BITWISE_OR:
		fprintf(out,"|");break;
	case OP_BITWISE_AND:
		fprintf(out,"&");break;
	case OP_BITWISE_XOR:
		fprintf(out,"^");break;
	case OP_BITWISE_NOT:
		fprintf(out,"~");break;
	case OP_ADDR_OF:
		fprintf(out,"&");break;
	case OP_DEREFERENCE:
		fprintf(out,"*");break;
	case OP_MEMBER_TROUGH_PTR:
		fprintf(out,"->");break;
	case OP_MEMBER:
		fprintf(out,".");break;
	case OP_ARR_SUBSCRIPT:
		fprintf(out,"ARR_SUBSCRIPT");break;
	case OP_POSTFIX_INC:
		fprintf(out,"++");break;
	case OP_POSTFIX_DEC:
		fprintf(out,"--");break;
	case OP_PREFIX_INC:
		fprintf(out,"++");break;
	case OP_PREFIX_DEC:
		fprintf(out,"--");break;
	case OP_UNARY_PLUS:
		fprintf(out,"+");break;
	case OP_UNARY_MINUS:
		fprintf(out,"-");break;
	case OP_CAST:
		fprintf(out,"CAST");break;
	case OP_SIZEOF:
		fprintf(out,"sizeof");break;
	case OP_SHIFT_LEFT:
		fprintf(out,"<<");break;
	case OP_SHIFT_RIGHT:
		fprintf(out,">>");break;
	case OP_LESS_EQ:
		fprintf(out,"<=");break;
	case OP_GREATER_EQ:
		fprintf(out,">=");break;
	case OP_LESS:
		fprintf(out,"<");break;
	case OP_GREATER:
		fprintf(out,">");break;
	case OP_EQUAL:
		fprintf(out,"==");break;
	case OP_NOT_EQUAL:
		fprintf(out,"!=");break;
	case OP_LVALUE:
		fprintf(out,"LVALUE");break;
	case OP_CONSTANT:
		fprintf(out,"CONSTANT");break;
	case OP_STRING_LITERAL:
		fprintf(out,"STRING_LITERAL");break;
	case ST_COMPOUND:
		fprintf(out,"COMPOUND");break;
	case ST_EXPRESSION:
		fprintf(out,"EXPRESSION");break;
	case ST_SWITCH:
		fprintf(out,"switch");break;
	case ST_IF:
		fprintf(out,"if");break;
	case ST_WHILE:
		fprintf(out,"while");break;
	case ST_DO_WHILE:
		fprintf(out,"do_while");break;
	case ST_GOTO:
		fprintf(out,"goto");break;
	case ST_LABEL:
		fprintf(out,"LABEL");break;
	case ST_CASE:
		fprintf(out,"case");break;
	case ST_DEFAULT:
		fprintf(out,"default");break;
	case ST_CONTINUE:
		fprintf(out,"continue");break;
	case ST_BREAK:
		fprintf(out,"break");break;
	case ST_RETURN:
		fprintf(out,"return");break;
	case ST_FOR:
		fprintf(out,"for");break;
	
		/*TODO obj dec obj def func decl*/
	case ST_FUNCTION_DEFINITION:
		fprintf(out,"FUNCTION_DEFINITION");break;
	case TRANSLATION_UNIT:
		fprintf(out,"TRANSLATION_UNIT");break;
	case ERROR:
		fprintf(out,"ERROR");break;
		default:
			fprintf(out,"NOT_POSSIBLE");break;
	}
}